

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O1

ostream * argparse::operator<<(ostream *stream,Argument *argument)

{
  ostream *poVar1;
  long lVar2;
  pointer __value;
  stringstream nameStream;
  ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
  local_1d0;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream_type local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  __value = (argument->mNames).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1d0._M_stream = local_1a0;
  local_1d0._M_string = " ";
  lVar2 = (long)(argument->mNames).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)__value >> 5;
  if (0 < lVar2) {
    lVar2 = lVar2 + 1;
    do {
      std::
      ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
      ::operator=(&local_1d0,__value);
      __value = __value + 1;
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  std::__cxx11::stringbuf::str();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)local_1d0._M_stream,(long)local_1d0._M_string);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(argument->mHelp)._M_dataplus._M_p,(argument->mHelp)._M_string_length);
  if (local_1d0._M_stream != (ostream_type *)local_1c0) {
    operator_delete(local_1d0._M_stream,local_1c0[0] + 1);
  }
  if ((argument->field_0xac & 2) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"[Required]",10);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return stream;
}

Assistant:

std::ostream &operator<<(std::ostream &stream,
                                  const Argument &argument) {
    std::stringstream nameStream;
    std::copy(std::begin(argument.mNames), std::end(argument.mNames),
              std::ostream_iterator<std::string>(nameStream, " "));
    stream << nameStream.str() << "\t" << argument.mHelp;
    if (argument.mIsRequired)
      stream << "[Required]";
    stream << "\n";
    return stream;
  }